

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheckedActualCall_multipleSameFunctionsExpectingAndHappenGradually_TestShell::
~TEST_MockCheckedActualCall_multipleSameFunctionsExpectingAndHappenGradually_TestShell
          (TEST_MockCheckedActualCall_multipleSameFunctionsExpectingAndHappenGradually_TestShell
           *this)

{
  TEST_MockCheckedActualCall_multipleSameFunctionsExpectingAndHappenGradually_TestShell *this_local;
  
  ~TEST_MockCheckedActualCall_multipleSameFunctionsExpectingAndHappenGradually_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCheckedActualCall, multipleSameFunctionsExpectingAndHappenGradually)
{
    MockCheckedExpectedCall* call1 = new MockCheckedExpectedCall();
    MockCheckedExpectedCall* call2 = new MockCheckedExpectedCall();
    call1->withName("func");
    call2->withName("func");
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);

    LONGS_EQUAL(2, list->amountOfUnfulfilledExpectations());

    MockCheckedActualCall actualCall1(1, reporter, *list);
    actualCall1.withName("func");
    actualCall1.checkExpectations();

    LONGS_EQUAL(1, list->amountOfUnfulfilledExpectations());

    MockCheckedActualCall actualCall2(2, reporter, *list);
    actualCall2.withName("func");
    actualCall2.checkExpectations();

    LONGS_EQUAL(0, list->amountOfUnfulfilledExpectations());

    list->deleteAllExpectationsAndClearList();
}